

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

int __thiscall glcts::LayoutBindingBaseCase::init(LayoutBindingBaseCase *this,EVP_PKEY_CTX *ctx)

{
  Vec4 *color;
  uint uVar1;
  pointer pLVar2;
  pointer pLVar3;
  Texture3D *this_00;
  Texture2DArray *this_01;
  int iVar4;
  undefined4 extraout_var;
  mapped_type this_02;
  undefined4 extraout_var_00;
  _Base_ptr p_Var5;
  mapped_type *ppTVar6;
  undefined4 extraout_var_01;
  mapped_type *ppTVar7;
  undefined4 extraout_var_02;
  mapped_type *ppTVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  LayoutBindingSubTest tests [14];
  allocator_type local_209;
  pointer local_208;
  pointer pLStack_200;
  pointer local_1f8;
  LayoutBindingSubTest local_1e8 [14];
  
  iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x14])();
  this->m_drawTest = (ulong)(iVar4 == 2) * 8 + 0x129;
  *(undefined8 *)&this->field_0x88 = 0;
  memcpy(local_1e8,&PTR_anon_var_dwarf_bfa7e6_020fd6c0,0x1c0);
  std::
  vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>>
  ::vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest_const*,void>
            ((vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>>
              *)&local_208,local_1e8,(LayoutBindingSubTest *)&stack0xffffffffffffffd8,&local_209);
  pLVar2 = (this->m_tests).
           super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar3 = (this->m_tests).
           super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_tests).
  super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  ._M_impl.super__Vector_impl_data._M_start = local_208;
  (this->m_tests).
  super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  ._M_impl.super__Vector_impl_data._M_finish = pLStack_200;
  (this->m_tests).
  super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1f8;
  local_1f8 = (pointer)0x0;
  local_208 = (pointer)0x0;
  pLStack_200 = (pointer)0x0;
  if (pLVar2 != (pointer)0x0) {
    operator_delete(pLVar2,(long)pLVar3 - (long)pLVar2);
    if (local_208 != (pointer)0x0) {
      operator_delete(local_208,(long)local_1f8 - (long)local_208);
    }
  }
  this->m_uniformDeclTemplate =
       "${LAYOUT}${KEYWORD}${UNIFORM_TYPE}${UNIFORM_BLOCK_NAME}${UNIFORM_BLOCK}${UNIFORM_INSTANCE_NAME}${UNIFORM_ARRAY};\n"
  ;
  color = &this->m_expectedColor;
  (this->m_expectedColor).m_data[0] = 0.0;
  (this->m_expectedColor).m_data[1] = 1.0;
  (this->m_expectedColor).m_data[2] = 0.0;
  (this->m_expectedColor).m_data[3] = 1.0;
  iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  uVar1 = *(uint *)(CONCAT44(extraout_var,iVar4) + 0xc);
  ppTVar6 = (mapped_type *)(ulong)uVar1;
  if (uVar1 == 5) {
    this_02 = (mapped_type)operator_new(0x70);
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
    glu::Texture2DArray::Texture2DArray
              ((Texture2DArray *)this_02,*(RenderContext **)(CONCAT44(extraout_var_02,iVar4) + 8),
               0x8058,2,2,1);
    tcu::Texture2DArray::allocLevel((Texture2DArray *)&this_02->m_isCompressed,0);
    tcu::clear((PixelBufferAccess *)
               (this_02->m_refTexture).super_TextureLevelPyramid.m_data.
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,color);
    glu::Texture2DArray::upload((Texture2DArray *)this_02);
    p_Var5 = (this->m_textures2DArray)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var5 != (_Base_ptr)0x0) {
      p_Var10 = &(this->m_textures2DArray)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = &p_Var10->_M_header;
      do {
        if (-1 < (int)p_Var5[1]._M_color) {
          p_Var9 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[p_Var5[1]._M_color >> 0x1f];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var9 != p_Var10) && ((int)p_Var9[1]._M_color < 1)) {
        local_208 = (pointer)((ulong)local_208 & 0xffffffff00000000);
        ppTVar8 = std::
                  map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
                  ::operator[](&this->m_textures2DArray,(key_type_conflict *)&local_208);
        this_01 = *ppTVar8;
        if (this_01 != (Texture2DArray *)0x0) {
          glu::Texture2DArray::~Texture2DArray(this_01);
        }
        operator_delete(this_01,0x70);
      }
    }
    local_208 = (pointer)((ulong)local_208 & 0xffffffff00000000);
    ppTVar6 = (mapped_type *)
              std::
              map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
              ::operator[](&this->m_textures2DArray,(key_type_conflict *)&local_208);
  }
  else if (uVar1 == 3) {
    this_02 = (mapped_type)operator_new(0x70);
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
    glu::Texture3D::Texture3D
              ((Texture3D *)this_02,*(RenderContext **)(CONCAT44(extraout_var_01,iVar4) + 8),0x8058,
               2,2,1);
    tcu::Texture3D::allocLevel((Texture3D *)&this_02->m_isCompressed,0);
    tcu::clear((PixelBufferAccess *)
               (this_02->m_refTexture).super_TextureLevelPyramid.m_data.
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,color);
    glu::Texture3D::upload((Texture3D *)this_02);
    p_Var5 = (this->m_textures3D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var5 != (_Base_ptr)0x0) {
      p_Var10 = &(this->m_textures3D)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = &p_Var10->_M_header;
      do {
        if (-1 < (int)p_Var5[1]._M_color) {
          p_Var9 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[p_Var5[1]._M_color >> 0x1f];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var9 != p_Var10) && ((int)p_Var9[1]._M_color < 1)) {
        local_208 = (pointer)((ulong)local_208 & 0xffffffff00000000);
        ppTVar7 = std::
                  map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
                  ::operator[](&this->m_textures3D,(key_type_conflict *)&local_208);
        this_00 = *ppTVar7;
        if (this_00 != (Texture3D *)0x0) {
          glu::Texture3D::~Texture3D(this_00);
        }
        operator_delete(this_00,0x70);
      }
    }
    local_208 = (pointer)((ulong)local_208 & 0xffffffff00000000);
    ppTVar6 = (mapped_type *)
              std::
              map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
              ::operator[](&this->m_textures3D,(key_type_conflict *)&local_208);
  }
  else {
    if (uVar1 != 2) goto LAB_00bd7d40;
    this_02 = (mapped_type)operator_new(0x70);
    iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
    glu::ImmutableTexture2D::ImmutableTexture2D
              ((ImmutableTexture2D *)this_02,
               *(RenderContext **)(CONCAT44(extraout_var_00,iVar4) + 8),0x8058,2,2);
    tcu::Texture2D::allocLevel(&this_02->m_refTexture,0);
    tcu::clear((this_02->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,color);
    (*((Texture2D *)&this_02->_vptr_Texture2D)->_vptr_Texture2D[2])(this_02);
    p_Var5 = (this->m_textures2D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var5 != (_Base_ptr)0x0) {
      p_Var10 = &(this->m_textures2D)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = &p_Var10->_M_header;
      do {
        if (-1 < (int)p_Var5[1]._M_color) {
          p_Var9 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[p_Var5[1]._M_color >> 0x1f];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var9 != p_Var10) && ((int)p_Var9[1]._M_color < 1)) {
        local_208 = (pointer)((ulong)local_208 & 0xffffffff00000000);
        ppTVar6 = std::
                  map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
                  ::operator[](&this->m_textures2D,(key_type_conflict *)&local_208);
        if (*ppTVar6 != (mapped_type)0x0) {
          (*(*ppTVar6)->_vptr_Texture2D[1])();
        }
      }
    }
    local_208 = (pointer)((ulong)local_208 & 0xffffffff00000000);
    ppTVar6 = std::
              map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
              ::operator[](&this->m_textures2D,(key_type_conflict *)&local_208);
  }
  *ppTVar6 = this_02;
LAB_00bd7d40:
  return (int)ppTVar6;
}

Assistant:

void init(void)
	{
		m_drawTest =
			(getStage() == ComputeShader) ? &LayoutBindingBaseCase::drawTestCompute : &LayoutBindingBaseCase::drawTest;

#define MAKE_TEST_ENTRY(__subtest_name__) { #__subtest_name__, "", &LayoutBindingBaseCase::__subtest_name__ }
		LayoutBindingSubTest tests[] = {
			MAKE_TEST_ENTRY(binding_basic_default),		 MAKE_TEST_ENTRY(binding_basic_explicit),
			MAKE_TEST_ENTRY(binding_basic_multiple),	 MAKE_TEST_ENTRY(binding_basic_render),
			MAKE_TEST_ENTRY(binding_integer_constant),   MAKE_TEST_ENTRY(binding_integer_constant_expression),
			MAKE_TEST_ENTRY(binding_array_size),		 MAKE_TEST_ENTRY(binding_array_implicit),
			MAKE_TEST_ENTRY(binding_array_multiple),	 MAKE_TEST_ENTRY(binding_api_update),
			MAKE_TEST_ENTRY(binding_compilation_errors), MAKE_TEST_ENTRY(binding_link_errors),
			MAKE_TEST_ENTRY(binding_examples),			 MAKE_TEST_ENTRY(binding_mixed_order)
		};
		m_tests = makeVector(tests);

		m_uniformDeclTemplate = "${LAYOUT}${KEYWORD}${UNIFORM_TYPE}${UNIFORM_BLOCK_NAME}${UNIFORM_BLOCK}${UNIFORM_"
								"INSTANCE_NAME}${UNIFORM_ARRAY};\n";

		m_expectedColor = tcu::Vec4(0.0, 1.0f, 0.0f, 1.0f);

		switch (getTestParameters().texture_type)
		{
		case TwoD:
		{
			// 2D
			glu::ImmutableTexture2D* texture2D =
				new glu::ImmutableTexture2D(getContext().getRenderContext(), GL_RGBA8, 2, 2);

			texture2D->getRefTexture().allocLevel(0);
			tcu::clear(texture2D->getRefTexture().getLevel(0), m_expectedColor);
			texture2D->upload();

			if (m_textures2D.find(0) != m_textures2D.end())
			{
				delete m_textures2D[0];
			}

			m_textures2D[0] = texture2D;
		}
		break;
		case TwoDArray:
		{
			// 2DArray
			glu::Texture2DArray* texture2DArray =
				new glu::Texture2DArray(getContext().getRenderContext(), GL_RGBA8, 2, 2, 1);

			texture2DArray->getRefTexture().allocLevel(0);
			tcu::clear(texture2DArray->getRefTexture().getLevel(0), m_expectedColor);
			texture2DArray->upload();

			if (m_textures2DArray.find(0) != m_textures2DArray.end())
			{
				delete m_textures2DArray[0];
			}

			m_textures2DArray[0] = texture2DArray;
		}
		break;
		// 3D
		case ThreeD:
		{
			glu::Texture3D* texture3D = new glu::Texture3D(getContext().getRenderContext(), GL_RGBA8, 2, 2, 1);

			texture3D->getRefTexture().allocLevel(0);
			tcu::clear(texture3D->getRefTexture().getLevel(0), m_expectedColor);
			texture3D->upload();

			if (m_textures3D.find(0) != m_textures3D.end())
			{
				delete m_textures3D[0];
			}

			m_textures3D[0] = texture3D;
		}
		break;
		case None:
			// test case where no texture allocation is needed
			break;
		default:
			DE_ASSERT(0);
			break;
		}
	}